

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS ParseForNewType(ParseParameters *Params,_Bool IsJson5,size_t *pErrorAtPos)

{
  ParseStack *__s;
  ParseStack *stackItem;
  size_t newStringIndex;
  JL_DATA_TYPE newType;
  JL_STATUS jlStatus;
  size_t *pErrorAtPos_local;
  ParseParameters *pPStack_10;
  _Bool IsJson5_local;
  ParseParameters *Params_local;
  
  newStringIndex._0_4_ = JL_DATA_TYPE_NONE;
  _newType = pErrorAtPos;
  pErrorAtPos_local._7_1_ = IsJson5;
  pPStack_10 = Params;
  newStringIndex._4_4_ =
       DetectNewType(Params->JsonString,Params->JsonStringLength,Params->StringIndex,IsJson5,
                     (size_t *)&stackItem,(JL_DATA_TYPE *)&newStringIndex,pErrorAtPos);
  if ((newStringIndex._4_4_ == JL_STATUS_SUCCESS) &&
     ((JL_DATA_TYPE)newStringIndex != JL_DATA_TYPE_NONE)) {
    if (pPStack_10->StackIndex < 0x41) {
      pPStack_10->StringIndex = (size_t)stackItem;
      pPStack_10->StackIndex = pPStack_10->StackIndex + 1;
      __s = pPStack_10->Stack + pPStack_10->StackIndex;
      memset(__s,0,0x28);
      __s->Type = (JL_DATA_TYPE)newStringIndex;
      newStringIndex._4_4_ =
           JlCreateObjectWithTag((JL_DATA_TYPE)newStringIndex,pPStack_10->StringIndex,&__s->Object);
    }
    else {
      newStringIndex._4_4_ = JL_STATUS_JSON_NESTING_TOO_DEEP;
    }
  }
  return newStringIndex._4_4_;
}

Assistant:

static
JL_STATUS
    ParseForNewType
    (
        ParseParameters*    Params,
        bool                IsJson5,
        size_t*             pErrorAtPos
    )
{
    JL_STATUS jlStatus;
    JL_DATA_TYPE newType = JL_DATA_TYPE_NONE;
    size_t newStringIndex;

    jlStatus = DetectNewType(
        Params->JsonString,
        Params->JsonStringLength,
        Params->StringIndex,
        IsJson5,
        &newStringIndex,
        &newType,
        pErrorAtPos );

    if( JL_STATUS_SUCCESS == jlStatus  &&  JL_DATA_TYPE_NONE != newType )
    {
        if( Params->StackIndex <= MAX_JSON_DEPTH )
        {
            Params->StringIndex = newStringIndex;
            Params->StackIndex += 1;
            ParseStack* stackItem = &Params->Stack[Params->StackIndex];
            memset( stackItem, 0, sizeof(*stackItem) );

            stackItem->Type = newType;
            jlStatus = JlCreateObjectWithTag( newType, Params->StringIndex, &stackItem->Object );
        }
        else
        {
            // JSON nesting too deep.
            jlStatus = JL_STATUS_JSON_NESTING_TOO_DEEP;
        }
    }

    return jlStatus;
}